

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

string * testing::internal::DeathTestThreadWarning_abi_cxx11_(size_t thread_count)

{
  Message *this;
  Message *val;
  long in_RSI;
  string *in_RDI;
  Message msg;
  char (*in_stack_ffffffffffffff88) [106];
  Message *in_stack_ffffffffffffff90;
  Message *in_stack_ffffffffffffff98;
  
  Message::Message((Message *)in_RDI);
  Message::operator<<(in_stack_ffffffffffffff90,(char (*) [53])in_stack_ffffffffffffff88);
  Message::operator<<(in_stack_ffffffffffffff90,(char (*) [40])in_stack_ffffffffffffff88);
  Message::operator<<(in_stack_ffffffffffffff90,(char (*) [12])in_stack_ffffffffffffff88);
  Message::operator<<(in_stack_ffffffffffffff90,(char (*) [2])in_stack_ffffffffffffff88);
  if (in_RSI == 0) {
    Message::operator<<(in_stack_ffffffffffffff90,(char (*) [39])in_stack_ffffffffffffff88);
  }
  else {
    Message::operator<<(in_stack_ffffffffffffff90,(char (*) [10])in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff98 =
         Message::operator<<(in_stack_ffffffffffffff90,(unsigned_long *)in_stack_ffffffffffffff88);
    Message::operator<<(in_stack_ffffffffffffff90,(char (*) [10])in_stack_ffffffffffffff88);
  }
  this = Message::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  val = Message::operator<<(this,(char (*) [61])in_stack_ffffffffffffff88);
  Message::operator<<(this,(char (*) [62])val);
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffff98);
  Message::~Message((Message *)0x18b2ee);
  return in_RDI;
}

Assistant:

static std::string DeathTestThreadWarning(size_t thread_count) {
  Message msg;
  msg << "Death tests use fork(), which is unsafe particularly"
      << " in a threaded context. For this test, " << GTEST_NAME_ << " ";
  if (thread_count == 0) {
    msg << "couldn't detect the number of threads.";
  } else {
    msg << "detected " << thread_count << " threads.";
  }
  msg << " See "
         "https://github.com/google/googletest/blob/master/googletest/docs/"
         "advanced.md#death-tests-and-threads"
      << " for more explanation and suggested solutions, especially if"
      << " this is the last message you see before your test times out.";
  return msg.GetString();
}